

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O0

_Bool borg_flow_commit(char *who,wchar_t why)

{
  uint uVar1;
  char *what;
  wchar_t cost;
  wchar_t why_local;
  char *who_local;
  
  uVar1 = (uint)borg_data_cost->data[borg.c.y][borg.c.x];
  if (uVar1 < 0xfa) {
    if (who != (char *)0x0) {
      what = format("# Flowing toward %s at cost %d",who,(ulong)uVar1);
      borg_note(what);
    }
    memcpy(borg_data_flow,borg_data_cost,0x330c);
    borg.goal.type = (int16_t)why;
    who_local._7_1_ = true;
  }
  else {
    who_local._7_1_ = false;
  }
  return who_local._7_1_;
}

Assistant:

bool borg_flow_commit(const char *who, int why)
{
    int cost;

    /* Cost of current grid */
    cost = borg_data_cost->data[borg.c.y][borg.c.x];

    /* Verify the total "cost" */
    if (cost >= 250)
        return false;

    /* Message */
    if (who)
        borg_note(format("# Flowing toward %s at cost %d", who, cost));

    /* Obtain the "flow" information */
    memcpy(borg_data_flow, borg_data_cost, sizeof(borg_data));

    /* Save the goal type */
    borg.goal.type = why;

    /* Success */
    return true;
}